

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

bool __thiscall DMenu::MouseEventBack(DMenu *this,int type,int x,int y)

{
  bool bVar1;
  byte bVar2;
  FTexture *pFVar3;
  uint uVar4;
  
  if (-1 < m_show_backbutton.Value) {
    pFVar3 = FTextureManager::operator()(&TexMan,gameinfo.mBackButton.Chars);
    if (pFVar3 == (FTexture *)0x0) {
      bVar2 = 0;
    }
    else {
      if ((m_show_backbutton.Value & 1U) != 0) {
        uVar4 = (uint)((double)((uint)pFVar3->Width * 2) / (pFVar3->Scale).X);
        x = (x - (screen->super_DSimpleCanvas).super_DCanvas.Width) +
            ((uVar4 & 1) + ((int)uVar4 >> 1)) * CleanXfac;
      }
      if ((m_show_backbutton.Value & 2U) != 0) {
        uVar4 = (uint)((double)((uint)pFVar3->Height * 2) / (pFVar3->Scale).Y);
        y = (y - (screen->super_DSimpleCanvas).super_DCanvas.Height) +
            ((uVar4 & 1) + ((int)uVar4 >> 1)) * CleanYfac;
      }
      if (x < 0) {
        bVar1 = false;
      }
      else {
        uVar4 = (uint)((double)((uint)pFVar3->Width * 2) / (pFVar3->Scale).X);
        bVar1 = false;
        if ((x < (int)(((uVar4 & 1) + ((int)uVar4 >> 1)) * CleanXfac)) && (bVar1 = false, -1 < y)) {
          uVar4 = (uint)((double)((uint)pFVar3->Height * 2) / (pFVar3->Scale).Y);
          bVar1 = y < (int)(((uVar4 & 1) + ((int)uVar4 >> 1)) * CleanYfac);
        }
      }
      (this->super_DObject).field_0x25 = bVar1;
      if ((type == 2) && (bVar1 != false)) {
        if (m_use_mouse.Value == 2) {
          (this->super_DObject).field_0x25 = 0;
        }
        (*(this->super_DObject)._vptr_DObject[8])(this,7,1);
      }
      bVar2 = (this->super_DObject).field_0x25;
    }
    if (pFVar3 != (FTexture *)0x0) goto LAB_0030a5ce;
  }
  bVar2 = 0;
LAB_0030a5ce:
  return (bool)(bVar2 & 1);
}

Assistant:

bool DMenu::MouseEventBack(int type, int x, int y)
{
	if (m_show_backbutton >= 0)
	{
		FTexture *tex = TexMan(gameinfo.mBackButton);
		if (tex != NULL)
		{
			if (m_show_backbutton&1) x -= screen->GetWidth() - tex->GetScaledWidth() * CleanXfac;
			if (m_show_backbutton&2) y -= screen->GetHeight() - tex->GetScaledHeight() * CleanYfac;
			mBackbuttonSelected = ( x >= 0 && x < tex->GetScaledWidth() * CleanXfac && 
									y >= 0 && y < tex->GetScaledHeight() * CleanYfac);
			if (mBackbuttonSelected && type == MOUSE_Release)
			{
				if (m_use_mouse == 2) mBackbuttonSelected = false;
				MenuEvent(MKEY_Back, true);
			}
			return mBackbuttonSelected;
		}
	}
	return false;
}